

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8b1c::do_pad_test_large_string
          (anon_unknown_dwarf_8b1c *this,key_encoder *enc,size_t nbytes,bool expect_truncation)

{
  undefined7 in_register_00000009;
  char *pcVar1;
  string_view sv;
  unsigned_long local_78;
  unsigned_long max_key_size;
  string buf;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  pcVar1 = (char *)CONCAT71(in_register_00000009,expect_truncation);
  max_key_size = (unsigned_long)&buf._M_string_length;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&max_key_size,
             (size_type)enc,'a');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&max_key_size,'\0'
            );
  sv._M_str = pcVar1;
  sv._M_len = max_key_size;
  do_simple_pad_test(this,enc,sv);
  if ((char)nbytes != '\0') {
    local_38._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0x110)
    ;
    local_78 = 0xffff;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)(buf.field_2._M_local_buf + 8),"(kv.size())","(max_key_size)",
               (unsigned_long *)&local_38,&local_78);
    if (buf.field_2._M_local_buf[8] == '\0') {
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x2d3,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
  }
  if ((size_type *)max_key_size != &buf._M_string_length) {
    operator_delete((void *)max_key_size,buf._M_string_length + 1);
  }
  return;
}

Assistant:

void do_pad_test_large_string(unodb::key_encoder& enc, size_t nbytes,
                              bool expect_truncation = false) {
  std::string buf(nbytes, 'a');
  buf.push_back('\0');
  do_simple_pad_test(enc, std::string_view(buf.data(), nbytes));
  if (expect_truncation) {
    const auto kv = enc.get_key_view();
    constexpr auto max_key_size = unodb::key_encoder::maxlen +
                                  sizeof(unodb::key_encoder::pad) +
                                  sizeof(unodb::key_encoder::size_type);
    UNODB_EXPECT_EQ(kv.size(), max_key_size);
  }
}